

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_Update(Fxu_Matrix *p,Fxu_Single *pSingle,Fxu_Double *pDouble)

{
  Fxu_Var *pVar1_00;
  Fxu_Var *pVar2_00;
  long lVar1;
  int iVar2;
  int iVar3;
  Fxu_Var *pVar2;
  Fxu_Var *pVar1;
  Fxu_Var *pVarD;
  Fxu_Var *pVarC;
  Fxu_Cube *pCubeNew;
  Fxu_Cube *pCube;
  Fxu_Double *pDouble_local;
  Fxu_Single *pSingle_local;
  Fxu_Matrix *p_local;
  
  pCube = (Fxu_Cube *)pDouble;
  pDouble_local = (Fxu_Double *)pSingle;
  pSingle_local = (Fxu_Single *)p;
  if (pSingle == (Fxu_Single *)0x0) {
    iVar3 = pDouble->Weight;
    iVar2 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
    if (iVar3 != iVar2) {
      __assert_fail("pDouble->Weight == Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x42,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
    }
    Fxu_UpdateDouble((Fxu_Matrix *)pSingle_local);
  }
  else if (pDouble == (Fxu_Double *)0x0) {
    iVar3 = pSingle->Weight;
    iVar2 = Fxu_HeapSingleReadMaxWeight(p->pHeapSingle);
    if (iVar3 != iVar2) {
      __assert_fail("pSingle->Weight == Fxu_HeapSingleReadMaxWeight( p->pHeapSingle )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x48,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
    }
    Fxu_UpdateSingle((Fxu_Matrix *)pSingle_local);
  }
  else {
    pVar1_00 = pSingle->pVar1;
    pVar2_00 = pSingle->pVar2;
    Fxu_HeapDoubleDelete(p->pHeapDouble,pDouble);
    Fxu_ListTableDelDivisor((Fxu_Matrix *)pSingle_local,(Fxu_Double *)pCube);
    Fxu_UpdateCreateNewVars((Fxu_Matrix *)pSingle_local,&pVarD,&pVar1,1);
    pVarC = (Fxu_Var *)Fxu_MatrixAddCube((Fxu_Matrix *)pSingle_local,pVar1,0);
    pVarC->pFirst = (Fxu_Cube *)pVarC;
    pVar1->pFirst = (Fxu_Cube *)pVarC;
    *(Fxu_Single **)&pSingle_local[3].Weight = pSingle_local + 3;
    pSingle_local[3].Num = 0;
    pSingle_local[3].HNum = 0;
    pSingle_local[3].pVar2 = (Fxu_Var *)&pSingle_local[3].pVar1;
    pSingle_local[3].pVar1 = (Fxu_Var *)0x0;
    *(Fxu_Var **)pSingle_local[3].pVar2 = pVar1_00;
    pSingle_local[3].pVar2 = (Fxu_Var *)&pVar1_00->pOrder;
    pVar1_00->pOrder = (Fxu_Var *)0x1;
    *(Fxu_Var **)pSingle_local[3].pVar2 = pVar2_00;
    pSingle_local[3].pVar2 = (Fxu_Var *)&pVar2_00->pOrder;
    pVar2_00->pOrder = (Fxu_Var *)0x1;
    Fxu_UpdateMatrixSingleClean((Fxu_Matrix *)pSingle_local,pVar1_00,pVar2_00,pVar1);
    Fxu_UpdateDoublePairs((Fxu_Matrix *)pSingle_local,(Fxu_Double *)pCube,pVarD);
    if (pVar2_00->iVar <= pVar1_00->iVar) {
      __assert_fail("pVar1->iVar < pVar2->iVar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x70,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
    }
    iVar3 = Fxu_SingleCountCoincidence((Fxu_Matrix *)pSingle_local,pVar1_00,pVar2_00);
    if (iVar3 != 0) {
      __assert_fail("Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x71,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
    }
    Fxu_MatrixAddLiteral((Fxu_Matrix *)pSingle_local,(Fxu_Cube *)pVarC,pVar1_00);
    Fxu_MatrixAddLiteral((Fxu_Matrix *)pSingle_local,(Fxu_Cube *)pVarC,pVar2_00);
    lVar1._0_4_ = pSingle_local[3].Num;
    lVar1._4_4_ = pSingle_local[3].HNum;
    if (lVar1 != 0) {
      for (pCubeNew = *(Fxu_Cube **)(pSingle_local + 3); pCubeNew != (Fxu_Cube *)0x1;
          pCubeNew = pCubeNew->pOrder) {
        Fxu_UpdateAddNewDoubles((Fxu_Matrix *)pSingle_local,pCubeNew);
      }
    }
    Fxu_UpdateCleanOldSingles((Fxu_Matrix *)pSingle_local);
    Fxu_MatrixRingCubesUnmark((Fxu_Matrix *)pSingle_local);
    Fxu_MatrixRingVarsUnmark((Fxu_Matrix *)pSingle_local);
    Fxu_UpdateAddNewSingles((Fxu_Matrix *)pSingle_local,pVarD);
    Fxu_UpdateAddNewSingles((Fxu_Matrix *)pSingle_local,pVar1);
    if (pCube != (Fxu_Cube *)0x0) {
      Fxu_MemRecycle((Fxu_Matrix *)pSingle_local,(char *)pCube,0x40);
    }
    pSingle_local[4].HNum = pSingle_local[4].HNum + 1;
  }
  return;
}

Assistant:

void Fxu_Update( Fxu_Matrix * p, Fxu_Single * pSingle, Fxu_Double * pDouble )
{
    Fxu_Cube * pCube, * pCubeNew;
    Fxu_Var * pVarC, * pVarD;
    Fxu_Var * pVar1, * pVar2;

    // consider trivial cases
    if ( pSingle == NULL )
    {
        assert( pDouble->Weight == Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble ) );
        Fxu_UpdateDouble( p );
        return;
    }
    if ( pDouble == NULL )
    {
        assert( pSingle->Weight == Fxu_HeapSingleReadMaxWeight( p->pHeapSingle ) );
        Fxu_UpdateSingle( p );
        return;
    }

    // get the variables of the single
    pVar1 = pSingle->pVar1;
    pVar2 = pSingle->pVar2;

    // remove the best double from the heap
    Fxu_HeapDoubleDelete( p->pHeapDouble, pDouble );
    // remove the best divisor from the table
    Fxu_ListTableDelDivisor( p, pDouble );

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 1 );
    // create one new row (cube)
    pCubeNew = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew->pFirst = pCubeNew;
    // set the first cube of the positive var
    pVarD->pFirst = pCubeNew;

    // start collecting the affected vars and cubes
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
    // add the vars
    Fxu_MatrixRingVarsAdd( p, pVar1 );
    Fxu_MatrixRingVarsAdd( p, pVar2 );
    // remove the literals and collect the affected cubes
    // remove the divisors associated with this cube
       // add to the affected cube the literal corresponding to the new column
    Fxu_UpdateMatrixSingleClean( p, pVar1, pVar2, pVarD );
    // replace each two cubes of the pair by one new cube
    // the new cube contains the base and the new literal
    Fxu_UpdateDoublePairs( p, pDouble, pVarC );
    // stop collecting the affected vars and cubes
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );

    // add the literals to the new cube
    assert( pVar1->iVar < pVar2->iVar );
    assert( Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar1 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar2 );

    // create new doubles; we cannot add them in the same loop
    // because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
           Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );

    // undo the temporary rings with cubes and vars
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );
    // we should undo the rings before creating new singles

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );

    // recycle the divisor
    MEM_FREE_FXU( p, Fxu_Double, 1, pDouble );
    p->nDivs3++;
}